

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIService.h
# Opt level: O0

optional<libchess::UCIGoParameters> *
libchess::UCIService::parse_go_line(istringstream *line_stream)

{
  bool bVar1;
  istream *piVar2;
  long *plVar3;
  uint uVar4;
  optional<int> in_RSI;
  optional<libchess::UCIGoParameters> *in_RDI;
  int movestogo;
  int binc;
  int btime;
  int winc;
  int wtime;
  int depth;
  int movetime;
  uint64_t nodes;
  string tmp;
  bool filling_searchmoves;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  searchmoves;
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  searchmoves_opt;
  bool ponder;
  bool infinite;
  optional<int> movestogo_opt;
  optional<int> binc_opt;
  optional<int> btime_opt;
  optional<int> winc_opt;
  optional<int> wtime_opt;
  optional<int> depth_opt;
  optional<int> movetime_opt;
  optional<unsigned_long> nodes_opt;
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffd68;
  UCIGoParameters *__t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  optional<libchess::UCIGoParameters> *this;
  value_type *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  undefined4 in_stack_fffffffffffffd8c;
  optional<int> *in_stack_fffffffffffffd98;
  undefined5 in_stack_fffffffffffffda0;
  byte bVar5;
  byte bVar6;
  undefined1 in_stack_fffffffffffffda7;
  UCIGoParameters *in_stack_fffffffffffffda8;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  optional<int> *in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffde8;
  optional<int> local_1c0 [18];
  undefined8 local_12c;
  int local_124;
  _Storage<unsigned_long,_true> local_120;
  int local_118;
  undefined8 local_114;
  int local_10c;
  _Optional_payload_base<int> local_108;
  int local_100;
  _Optional_payload_base<int> local_fc;
  int local_f4;
  _Optional_payload_base<int> local_f0;
  int local_e8;
  _Optional_payload_base<int> local_e4;
  int local_dc;
  _Optional_payload_base<int> local_d8;
  _Optional_payload_base<int> local_d0;
  ulong local_c8;
  string local_c0 [39];
  byte local_99;
  byte local_5a;
  byte local_59;
  undefined8 local_58;
  undefined1 local_50 [80];
  
  local_50._64_8_ =
       in_RSI.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>;
  std::optional<unsigned_long>::optional((optional<unsigned_long> *)0x14ce37);
  std::optional<int>::optional((optional<int> *)0x14ce44);
  std::optional<int>::optional((optional<int> *)0x14ce51);
  std::optional<int>::optional((optional<int> *)0x14ce5e);
  std::optional<int>::optional((optional<int> *)0x14ce6b);
  std::optional<int>::optional((optional<int> *)0x14ce78);
  std::optional<int>::optional((optional<int> *)0x14ce85);
  std::optional<int>::optional((optional<int> *)0x14ce92);
  local_59 = 0;
  local_5a = 0;
  std::
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::optional((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x14ceaf);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x14cebc);
  local_99 = 0;
  std::__cxx11::string::string(local_c0);
  while( true ) {
    piVar2 = std::operator>>((istream *)local_50._64_8_,local_c0);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    bVar1 = std::operator==(in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
    if (bVar1) {
      local_c8 = 0;
      plVar3 = (long *)std::istream::operator>>((istream *)local_50._64_8_,&local_c8);
      bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
      if (bVar1) {
        std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                  ((optional<unsigned_long> *)in_stack_fffffffffffffd70,
                   (unsigned_long *)in_stack_fffffffffffffd68);
        local_50._48_4_ = local_d8._M_payload;
        local_50[0x34] = local_d8._M_engaged;
        local_50._53_3_ = local_d8._5_3_;
        local_50._56_4_ = local_d0._M_payload;
        local_50[0x3c] = local_d0._M_engaged;
        local_50._61_3_ = local_d0._5_3_;
      }
LAB_0014d485:
      local_99 = 0;
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
      if (bVar1) {
        local_dc = 0;
        plVar3 = (long *)std::istream::operator>>((istream *)local_50._64_8_,&local_dc);
        bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
        if (bVar1) {
          std::optional<int>::optional<int_&,_true>
                    ((optional<int> *)in_stack_fffffffffffffd70,(int *)in_stack_fffffffffffffd68);
          local_50._40_4_ = local_e4._M_payload;
          local_50[0x2c] = local_e4._M_engaged;
          local_50._45_3_ = local_e4._5_3_;
        }
        goto LAB_0014d485;
      }
      bVar1 = std::operator==(in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
      if (bVar1) {
        local_e8 = 0;
        plVar3 = (long *)std::istream::operator>>((istream *)local_50._64_8_,&local_e8);
        bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
        if (bVar1) {
          std::optional<int>::optional<int_&,_true>
                    ((optional<int> *)in_stack_fffffffffffffd70,(int *)in_stack_fffffffffffffd68);
          local_50._32_4_ = local_f0._M_payload;
          local_50[0x24] = local_f0._M_engaged;
          local_50._37_3_ = local_f0._5_3_;
        }
        goto LAB_0014d485;
      }
      bVar1 = std::operator==(in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
      if (bVar1) {
        local_f4 = 0;
        in_stack_fffffffffffffde8 =
             (optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)std::istream::operator>>((istream *)local_50._64_8_,&local_f4);
        bVar1 = std::ios::operator_cast_to_bool
                          ((ios *)((long)&(in_stack_fffffffffffffde8->
                                          super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                                          )._M_payload.
                                          super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ._M_payload +
                                  *(long *)(*(long *)&(in_stack_fffffffffffffde8->
                                                                                                            
                                                  super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                                                  )._M_payload.
                                                  super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_payload._M_value.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl + -0x18)));
        if (bVar1) {
          std::optional<int>::optional<int_&,_true>
                    ((optional<int> *)in_stack_fffffffffffffd70,(int *)in_stack_fffffffffffffd68);
          local_50._24_4_ = local_fc._M_payload;
          local_50[0x1c] = local_fc._M_engaged;
          local_50._29_3_ = local_fc._5_3_;
        }
        goto LAB_0014d485;
      }
      bVar1 = std::operator==(in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
      if (bVar1) {
        local_100 = 0;
        plVar3 = (long *)std::istream::operator>>((istream *)local_50._64_8_,&local_100);
        in_stack_fffffffffffffdd7 =
             std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
        if ((bool)in_stack_fffffffffffffdd7) {
          std::optional<int>::optional<int_&,_true>
                    ((optional<int> *)in_stack_fffffffffffffd70,(int *)in_stack_fffffffffffffd68);
          local_50._16_4_ = local_108._M_payload;
          local_50[0x14] = local_108._M_engaged;
          local_50._21_3_ = local_108._5_3_;
        }
        goto LAB_0014d485;
      }
      bVar1 = std::operator==(in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
      if (bVar1) {
        local_10c = 0;
        in_stack_fffffffffffffdc8 =
             (optional<int> *)std::istream::operator>>((istream *)local_50._64_8_,&local_10c);
        in_stack_fffffffffffffdc7 =
             std::ios::operator_cast_to_bool
                       ((ios *)((long)&(in_stack_fffffffffffffdc8->
                                       super__Optional_base<int,_true,_true>)._M_payload.
                                       super__Optional_payload_base<int>._M_payload +
                               *(long *)((long)(in_stack_fffffffffffffdc8->
                                               super__Optional_base<int,_true,_true>)._M_payload.
                                               super__Optional_payload_base<int> + -0x18)));
        if ((bool)in_stack_fffffffffffffdc7) {
          std::optional<int>::optional<int_&,_true>
                    ((optional<int> *)in_stack_fffffffffffffd70,(int *)in_stack_fffffffffffffd68);
          local_50._8_8_ = local_114;
        }
        goto LAB_0014d485;
      }
      bVar1 = std::operator==(in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
      if (bVar1) {
        local_118 = 0;
        plVar3 = (long *)std::istream::operator>>((istream *)local_50._64_8_,&local_118);
        bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
        if (bVar1) {
          std::optional<int>::optional<int_&,_true>
                    ((optional<int> *)in_stack_fffffffffffffd70,(int *)in_stack_fffffffffffffd68);
          local_50._0_8_ = local_120;
        }
        goto LAB_0014d485;
      }
      bVar1 = std::operator==(in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
      if (bVar1) {
        local_124 = 0;
        in_stack_fffffffffffffda8 =
             (UCIGoParameters *)std::istream::operator>>((istream *)local_50._64_8_,&local_124);
        in_stack_fffffffffffffda7 =
             std::ios::operator_cast_to_bool
                       ((ios *)((long)&(in_stack_fffffffffffffda8->nodes_).
                                       super__Optional_base<unsigned_long,_true,_true>._M_payload.
                                       super__Optional_payload_base<unsigned_long>._M_payload +
                               *(long *)((in_stack_fffffffffffffda8->nodes_).
                                         super__Optional_base<unsigned_long,_true,_true>._M_payload.
                                         super__Optional_payload_base<unsigned_long>._M_payload.
                                         _M_value - 0x18)));
        if ((bool)in_stack_fffffffffffffda7) {
          std::optional<int>::optional<int_&,_true>
                    ((optional<int> *)in_stack_fffffffffffffd70,(int *)in_stack_fffffffffffffd68);
          local_58 = local_12c;
        }
        goto LAB_0014d485;
      }
      bVar1 = std::operator==(in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
      if (bVar1) {
        local_59 = 1;
        goto LAB_0014d485;
      }
      bVar1 = std::operator==(in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
      if (bVar1) {
        local_5a = 1;
        goto LAB_0014d485;
      }
      bVar1 = std::operator==(in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
      if (bVar1) {
        local_99 = 1;
      }
      else {
        if ((local_99 & 1) == 0) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                    in_stack_fffffffffffffd78);
      }
    }
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  if (!bVar1) {
    std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
              ((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffd78);
  }
  bVar5 = local_59;
  bVar6 = local_5a;
  std::
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::optional((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  uVar4 = bVar5 & 1;
  this = (optional<libchess::UCIGoParameters> *)local_50;
  __t = (UCIGoParameters *)(local_50 + 8);
  UCIGoParameters::UCIGoParameters
            (in_stack_fffffffffffffda8,
             (optional<unsigned_long> *)
             CONCAT17(in_stack_fffffffffffffda7,
                      CONCAT16(bVar6,CONCAT15(bVar5,in_stack_fffffffffffffda0))),
             in_stack_fffffffffffffd98,local_1c0,
             (optional<int> *)(CONCAT44(in_stack_fffffffffffffd8c,(uint)bVar6) & 0xffffffff00000001)
             ,(optional<int> *)
              (CONCAT44(in_stack_fffffffffffffd84,(uint)bVar5) & 0xffffffff00000001),
             (optional<int> *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
             in_stack_fffffffffffffdc8,
             (optional<int> *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
             SUB81((ulong)&local_58 >> 0x38,0),SUB81((ulong)&local_58 >> 0x30,0),
             in_stack_fffffffffffffde8);
  std::optional<libchess::UCIGoParameters>::optional<libchess::UCIGoParameters,_true>(this,__t);
  UCIGoParameters::~UCIGoParameters((UCIGoParameters *)0x14d58e);
  std::
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~optional((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x14d59b);
  std::__cxx11::string::~string(local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffd84,uVar4));
  std::
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~optional((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x14d5c2);
  return in_RDI;
}

Assistant:

static std::optional<UCIGoParameters> parse_go_line(std::istringstream& line_stream) noexcept {
        std::optional<std::uint64_t> nodes_opt;
        std::optional<int> movetime_opt;
        std::optional<int> depth_opt;
        std::optional<int> wtime_opt;
        std::optional<int> winc_opt;
        std::optional<int> btime_opt;
        std::optional<int> binc_opt;
        std::optional<int> movestogo_opt;
        bool infinite = false;
        bool ponder = false;
        std::optional<std::vector<std::string>> searchmoves_opt;

        std::vector<std::string> searchmoves;
        bool filling_searchmoves = false;
        std::string tmp;
        while (line_stream >> tmp) {
            if (tmp == "nodes") {
                std::uint64_t nodes = 0;
                if (line_stream >> nodes) {
                    nodes_opt = nodes;
                }
            } else if (tmp == "movetime") {
                int movetime = 0;
                if (line_stream >> movetime) {
                    movetime_opt = movetime;
                }
            } else if (tmp == "depth") {
                int depth = 0;
                if (line_stream >> depth) {
                    depth_opt = depth;
                }
            } else if (tmp == "wtime") {
                int wtime = 0;
                if (line_stream >> wtime) {
                    wtime_opt = wtime;
                }
            } else if (tmp == "winc") {
                int winc = 0;
                if (line_stream >> winc) {
                    winc_opt = winc;
                }
            } else if (tmp == "btime") {
                int btime = 0;
                if (line_stream >> btime) {
                    btime_opt = btime;
                }
            } else if (tmp == "binc") {
                int binc = 0;
                if (line_stream >> binc) {
                    binc_opt = binc;
                }
            } else if (tmp == "movestogo") {
                int movestogo = 0;
                if (line_stream >> movestogo) {
                    movestogo_opt = movestogo;
                }
            } else if (tmp == "infinite") {
                infinite = true;
            } else if (tmp == "ponder") {
                ponder = true;
            } else if (tmp == "searchmoves") {
                filling_searchmoves = true;
                continue;
            } else if (filling_searchmoves) {
                searchmoves.push_back(tmp);
                continue;
            } else {
                break;
            }
            filling_searchmoves = false;
        }
        if (!searchmoves.empty()) {
            searchmoves_opt = searchmoves;
        }

        return UCIGoParameters{nodes_opt,
                               movetime_opt,
                               depth_opt,
                               wtime_opt,
                               winc_opt,
                               btime_opt,
                               binc_opt,
                               movestogo_opt,
                               infinite,
                               ponder,
                               searchmoves_opt};
    }